

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

int __thiscall
kj::CapabilityStreamNetworkAddress::connect
          (CapabilityStreamNetworkAddress *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  _func_int **pp_Var1;
  Own<kj::AsyncCapabilityStream> *pOVar2;
  undefined4 in_register_0000000c;
  Type *func;
  undefined4 in_register_00000034;
  AsyncCapabilityStream *pAVar3;
  undefined1 local_91;
  CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_c__:1955:35),_kj::Own<kj::AsyncCapabilityStream>_>
  local_90;
  Own<kj::AsyncCapabilityStream> local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [8];
  Own<kj::AsyncCapabilityStream> result;
  CapabilityPipe pipe;
  CapabilityStreamNetworkAddress *this_local;
  
  pAVar3 = (AsyncCapabilityStream *)CONCAT44(in_register_00000034,__fd);
  func = (Type *)CONCAT44(in_register_0000000c,__len);
  pipe.ends[1].ptr = pAVar3;
  (**(code **)(*(pAVar3->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream + 0x10
              ))();
  pOVar2 = mv<kj::Own<kj::AsyncCapabilityStream>>((Own<kj::AsyncCapabilityStream> *)&result.ptr);
  Own<kj::AsyncCapabilityStream>::Own((Own<kj::AsyncCapabilityStream> *)local_48,pOVar2);
  pp_Var1 = pAVar3[1].super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream;
  pOVar2 = mv<kj::Own<kj::AsyncCapabilityStream>>
                     ((Own<kj::AsyncCapabilityStream> *)&pipe.ends[0].ptr);
  Own<kj::AsyncCapabilityStream>::Own(&local_68,pOVar2);
  (**(code **)(*pp_Var1 + 0x58))(local_58,pp_Var1,&local_68);
  mvCapture<kj::CapabilityStreamNetworkAddress::connect()::__0,kj::Own<kj::AsyncCapabilityStream>&>
            (&local_90,(kj *)local_48,(Own<kj::AsyncCapabilityStream> *)&local_91,func);
  Promise<void>::
  then<kj::CaptureByMove<kj::CapabilityStreamNetworkAddress::connect()::__0,kj::Own<kj::AsyncCapabilityStream>>,kj::_::PropagateException>
            ((Promise<void> *)this,
             (CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_c__:1955:35),_kj::Own<kj::AsyncCapabilityStream>_>
              *)local_58,(PropagateException *)&local_90);
  CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:1955:35),_kj::Own<kj::AsyncCapabilityStream>_>
  ::~CaptureByMove(&local_90);
  Promise<void>::~Promise((Promise<void> *)local_58);
  Own<kj::AsyncCapabilityStream>::~Own(&local_68);
  Own<kj::AsyncCapabilityStream>::~Own((Own<kj::AsyncCapabilityStream> *)local_48);
  CapabilityPipe::~CapabilityPipe((CapabilityPipe *)&result.ptr);
  return (int)this;
}

Assistant:

Promise<Own<AsyncIoStream>> CapabilityStreamNetworkAddress::connect() {
  auto pipe = provider.newCapabilityPipe();
  auto result = kj::mv(pipe.ends[0]);
  return inner.sendStream(kj::mv(pipe.ends[1]))
      .then(kj::mvCapture(result, [](Own<AsyncIoStream>&& result) {
    return kj::mv(result);
  }));
}